

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

void __thiscall S2LogMessage::~S2LogMessage(S2LogMessage *this)

{
  char cVar1;
  
  if (0 < (int)this->severity_) {
    cVar1 = (char)this->stream_;
    std::ios::widen((char)this->stream_->_vptr_basic_ostream[-3] + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

bool enabled() const {
#ifdef ABSL_MIN_LOG_LEVEL
    return (static_cast<int>(severity_) >= ABSL_MIN_LOG_LEVEL ||
            severity_ >= absl::LogSeverity::kFatal);
#else
    return true;
#endif
  }